

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::FieldDef::Deserialize(FieldDef *this,Parser *parser,Field *field)

{
  SymbolTable<flatbuffers::Value> *attributes;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  bool bVar4;
  ushort uVar5;
  ulong uVar6;
  long lVar7;
  const_iterator cVar8;
  const_iterator cVar9;
  unsigned_short vtsize;
  voffset_t vVar10;
  ushort uVar11;
  Presence PVar12;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  Presence PVar13;
  StructDef *pSVar14;
  bool bVar15;
  double t;
  string nested_qualified_name;
  string local_58;
  _Base_ptr local_38;
  
  if (*(ushort *)(field + -(long)*(int *)field) < 5) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(field + (4 - (long)*(int *)field));
  }
  uVar6 = (ulong)uVar5;
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,field + *(uint *)(field + uVar6) + uVar6 + 4,
             field + (ulong)*(uint *)(field + *(uint *)(field + uVar6) + uVar6) +
                     *(uint *)(field + uVar6) + uVar6 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->super_Definition).defined_namespace = parser->current_namespace_;
  if (*(ushort *)(field + -(long)*(int *)field) < 7) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(field + (6 - (long)*(int *)field));
  }
  if (uVar5 == 0) {
    type = (Type *)0x0;
  }
  else {
    type = (Type *)(field + (ulong)*(uint *)(field + uVar5) + (ulong)uVar5);
  }
  bVar4 = Type::Deserialize(&(this->value).type,parser,type);
  if (!bVar4) {
    return false;
  }
  lVar7 = -(long)*(int *)field;
  if (*(ushort *)(field + -(long)*(int *)field) < 0xb) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(field + lVar7 + 10);
  }
  if (uVar5 == 0) {
    vVar10 = 0;
  }
  else {
    vVar10 = *(voffset_t *)(field + uVar5);
  }
  (this->value).offset = vVar10;
  BVar3 = (this->value).type.base_type;
  if (BVar3 - BASE_TYPE_UTYPE < 10) {
    if (*(ushort *)(field + lVar7) < 0xd) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(field + lVar7 + 0xc);
    }
    if (uVar5 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = *(long *)(field + uVar5);
    }
    NumToString<long>(&local_58,lVar7);
  }
  else {
    if (1 < BVar3 - BASE_TYPE_FLOAT) goto LAB_001345fc;
    if (*(ushort *)(field + lVar7) < 0xf) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(field + lVar7 + 0xe);
    }
    if (uVar5 == 0) {
      t = 0.0;
    }
    else {
      t = *(double *)(field + uVar5);
    }
    FloatToString<double>(&local_58,t,0x11);
  }
  std::__cxx11::string::operator=((string *)&(this->value).constant,(string *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_001345fc:
  lVar7 = -(long)*(int *)field;
  uVar5 = *(ushort *)(field + -(long)*(int *)field);
  if (uVar5 < 0x1b) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(ushort *)(field + lVar7 + 0x1a);
  }
  if (uVar11 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = field[uVar11].super_Table != (Table)0x0;
  }
  if (uVar5 < 0x13) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(ushort *)(field + lVar7 + 0x12);
  }
  if (uVar11 == 0) {
    bVar15 = false;
  }
  else {
    bVar15 = field[uVar11].super_Table != (Table)0x0;
  }
  if ((bVar4 & bVar15) == 1) {
    __assert_fail("!(required && optional)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x178,"static Presence flatbuffers::FieldDef::MakeFieldPresence(bool, bool)");
  }
  PVar12 = kRequired;
  PVar13 = kDefault - bVar4;
  if (bVar15 != false) {
    PVar13 = PVar12;
  }
  this->presence = PVar13;
  if (0x1c < uVar5) {
    PVar12 = (Presence)*(ushort *)(field + lVar7 + 0x1c);
  }
  if ((short)PVar12 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)*(ushort *)(field + PVar12);
  }
  this->padding = uVar6;
  if (uVar5 < 0x15) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(ushort *)(field + lVar7 + 0x14);
  }
  if (uVar11 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = field[uVar11].super_Table != (Table)0x0;
  }
  this->key = bVar4;
  if (uVar5 < 0x1f) {
    uVar11 = 0;
  }
  else {
    uVar11 = *(ushort *)(field + lVar7 + 0x1e);
  }
  if (uVar11 == 0) {
    bVar4 = false;
  }
  else {
    bVar4 = field[uVar11].super_Table != (Table)0x0;
  }
  this->offset64 = bVar4;
  if (uVar5 < 0x17) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(field + lVar7 + 0x16);
  }
  if (uVar5 == 0) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (field + (ulong)*(uint *)(field + uVar5) + (ulong)uVar5);
  }
  attributes = &(this->super_Definition).attributes;
  bVar4 = DeserializeAttributesCommon(attributes,parser,attrs);
  if (bVar4) {
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"flexbuffer","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)attributes,&local_58);
    local_38 = &(this->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                _M_header;
    if (cVar8._M_node == local_38) {
      bVar4 = true;
    }
    else {
      bVar4 = *(long *)(cVar8._M_node + 2) == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      this->flexbuffer = true;
      parser->uses_flexbuffers_ = true;
      if ((this->value).type.base_type != BASE_TYPE_VECTOR) {
        return false;
      }
      if ((this->value).type.element != BASE_TYPE_UCHAR) {
        return false;
      }
    }
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"nested_flatbuffer","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)attributes,&local_58);
    if (cVar8._M_node == local_38) {
      lVar7 = 0;
    }
    else {
      lVar7 = *(long *)(cVar8._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (lVar7 != 0) {
      Namespace::GetFullyQualifiedName
                (&local_58,parser->current_namespace_,(string *)(lVar7 + 0x20),1000);
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                      *)&parser->structs_,&local_58);
      if ((_Rb_tree_header *)cVar9._M_node ==
          &(parser->structs_).dict._M_t._M_impl.super__Rb_tree_header) {
        pSVar14 = (StructDef *)0x0;
      }
      else {
        pSVar14 = *(StructDef **)(cVar9._M_node + 2);
      }
      if (pSVar14 != (StructDef *)0x0) {
        piVar1 = &(pSVar14->super_Definition).refcount;
        *piVar1 = *piVar1 + 1;
      }
      this->nested_flatbuffer = pSVar14;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (pSVar14 == (StructDef *)0x0) {
        return false;
      }
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"shared","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)attributes,&local_58);
    if (cVar8._M_node == local_38) {
      bVar4 = false;
    }
    else {
      bVar4 = *(long *)(cVar8._M_node + 2) != 0;
    }
    this->shared = bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (*(ushort *)(field + -(long)*(int *)field) < 0x19) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(field + (0x18 - (long)*(int *)field));
    }
    if (uVar5 == 0) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (field + (ulong)*(uint *)(field + uVar5) + (ulong)uVar5);
    }
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    return true;
  }
  return false;
}

Assistant:

bool FieldDef::Deserialize(Parser &parser, const reflection::Field *field) {
  name = field->name()->str();
  defined_namespace = parser.current_namespace_;
  if (!value.type.Deserialize(parser, field->type())) return false;
  value.offset = field->offset();
  if (IsInteger(value.type.base_type)) {
    value.constant = NumToString(field->default_integer());
  } else if (IsFloat(value.type.base_type)) {
    value.constant = FloatToString(field->default_real(), 17);
  }
  presence = FieldDef::MakeFieldPresence(field->optional(), field->required());
  padding = field->padding();
  key = field->key();
  offset64 = field->offset64();
  if (!DeserializeAttributes(parser, field->attributes())) return false;
  // TODO: this should probably be handled by a separate attribute
  if (attributes.Lookup("flexbuffer")) {
    flexbuffer = true;
    parser.uses_flexbuffers_ = true;
    if (value.type.base_type != BASE_TYPE_VECTOR ||
        value.type.element != BASE_TYPE_UCHAR)
      return false;
  }
  if (auto nested = attributes.Lookup("nested_flatbuffer")) {
    auto nested_qualified_name =
        parser.current_namespace_->GetFullyQualifiedName(nested->constant);
    nested_flatbuffer = parser.LookupStruct(nested_qualified_name);
    if (!nested_flatbuffer) return false;
  }
  shared = attributes.Lookup("shared") != nullptr;
  DeserializeDoc(doc_comment, field->documentation());
  return true;
}